

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpinternalsourcedata.h
# Opt level: O3

void __thiscall jrtplib::RTPInternalSourceData::SentRTPPacket(RTPInternalSourceData *this)

{
  double dVar1;
  timespec tpMono;
  timespec tpMono_1;
  timespec local_38;
  timespec local_28;
  
  if ((this->super_RTPSourceData).ownssrc == true) {
    if (RTPTime::CurrentTime()::s_initialized == '\0') {
      RTPTime::CurrentTime()::s_initialized = '\x01';
      clock_gettime(0,&local_38);
      clock_gettime(1,&local_28);
      dVar1 = (double)local_38.tv_nsec * 1e-09 + (double)local_38.tv_sec;
      RTPTime::CurrentTime()::s_startOffet =
           dVar1 - ((double)local_28.tv_nsec * 1e-09 + (double)local_28.tv_sec);
    }
    else {
      clock_gettime(1,&local_38);
      dVar1 = (double)local_38.tv_nsec * 1e-09 + (double)local_38.tv_sec +
              RTPTime::CurrentTime()::s_startOffet;
    }
    (this->super_RTPSourceData).issender = true;
    (this->super_RTPSourceData).stats.lastrtptime.m_t = dVar1;
    (this->super_RTPSourceData).stats.lastmsgtime.m_t = dVar1;
  }
  return;
}

Assistant:

void SentRTPPacket()										{ if (!ownssrc) return; RTPTime t = RTPTime::CurrentTime(); issender = true; stats.SetLastRTPPacketTime(t); stats.SetLastMessageTime(t); }